

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::
     generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)3>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool allowMatrixCases,int expandLevel)

{
  undefined4 uVar1;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  Node *pNVar4;
  SharedPtrStateBase *pSVar5;
  ResourceTestCase *this;
  undefined7 in_register_00000009;
  deInt32 *pdVar6;
  long lVar7;
  SharedPtr variable;
  SharedPtr local_60;
  TestNode *local_50;
  Context *local_48;
  SharedPtr *local_40;
  ProgramResourceQueryTestTarget local_38;
  
  lVar7 = 0;
  local_50 = &targetGroup->super_TestNode;
  local_48 = context;
  local_40 = parentStructure;
  do {
    if (*(int *)((long)&generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)3>
                        ::variableTypes[0].level + lVar7) <=
        (int)CONCAT71(in_register_00000009,allowMatrixCases)) {
      pNVar4 = (Node *)operator_new(0x28);
      uVar1 = *(undefined4 *)
               ((long)&generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)3>
                       ::variableTypes[0].type + lVar7);
      pNVar2 = local_40->m_ptr;
      pSVar3 = local_40->m_state;
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar4->m_type = TYPE_VARIABLE;
      (pNVar4->m_enclosingNode).m_ptr = pNVar2;
      (pNVar4->m_enclosingNode).m_state = pSVar3;
      if (pSVar3 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar6 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar6 = *pdVar6 + 1;
        UNLOCK();
      }
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
      *(undefined4 *)&pNVar4[1]._vptr_Node = uVar1;
      local_60.m_state = (SharedPtrStateBase *)0x0;
      local_60.m_ptr = pNVar4;
      pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar5->strongRefCount = 0;
      pSVar5->weakRefCount = 0;
      pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar5->strongRefCount = 1;
      pSVar5->weakRefCount = 1;
      local_60.m_state = pSVar5;
      this = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                (&local_38,PROGRAMINTERFACE_PROGRAM_INPUT,0x800);
      ResourceTestCase::ResourceTestCase(this,local_48,&local_60,&local_38,(char *)0x0);
      tcu::TestNode::addChild(local_50,(TestNode *)this);
      pSVar3 = local_60.m_state;
      pdVar6 = &pSVar5->strongRefCount;
      LOCK();
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_60.m_ptr = (Node *)0x0;
        (*(local_60.m_state)->_vptr_SharedPtrStateBase[2])(local_60.m_state);
      }
      LOCK();
      pdVar6 = &pSVar3->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_60.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_60.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    lVar7 = lVar7 + 0xc;
  } while (lVar7 != 0xfc);
  return;
}

Assistant:

static void generateProgramInputOutputTypeBasicTypeCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool allowMatrixCases, int expandLevel)
{
	static const struct
	{
		glu::DataType	type;
		bool			isMatrix;
		int				level;
	} variableTypes[] =
	{
		{ glu::TYPE_FLOAT,			false,		0	},
		{ glu::TYPE_INT,			false,		1	},
		{ glu::TYPE_UINT,			false,		1	},
		{ glu::TYPE_FLOAT_VEC2,		false,		2	},
		{ glu::TYPE_FLOAT_VEC3,		false,		1	},
		{ glu::TYPE_FLOAT_VEC4,		false,		2	},
		{ glu::TYPE_INT_VEC2,		false,		0	},
		{ glu::TYPE_INT_VEC3,		false,		2	},
		{ glu::TYPE_INT_VEC4,		false,		2	},
		{ glu::TYPE_UINT_VEC2,		false,		2	},
		{ glu::TYPE_UINT_VEC3,		false,		2	},
		{ glu::TYPE_UINT_VEC4,		false,		0	},
		{ glu::TYPE_FLOAT_MAT2,		true,		2	},
		{ glu::TYPE_FLOAT_MAT2X3,	true,		2	},
		{ glu::TYPE_FLOAT_MAT2X4,	true,		2	},
		{ glu::TYPE_FLOAT_MAT3X2,	true,		0	},
		{ glu::TYPE_FLOAT_MAT3,		true,		2	},
		{ glu::TYPE_FLOAT_MAT3X4,	true,		2	},
		{ glu::TYPE_FLOAT_MAT4X2,	true,		2	},
		{ glu::TYPE_FLOAT_MAT4X3,	true,		2	},
		{ glu::TYPE_FLOAT_MAT4,		true,		2	},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(variableTypes); ++ndx)
	{
		if (!allowMatrixCases && variableTypes[ndx].isMatrix)
			continue;

		if (variableTypes[ndx].level <= expandLevel)
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, variableTypes[ndx].type));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(interface, PROGRAMRESOURCEPROP_TYPE)));
		}
	}
}